

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O1

bool __thiscall
ON_HistoryRecord::SetUuidValues(ON_HistoryRecord *this,int value_id,int count,ON_UUID *u)

{
  ON_Value *pOVar1;
  
  pOVar1 = FindValueHelper(this,value_id,0xb,true);
  if (pOVar1 != (ON_Value *)0x0) {
    if (-1 < *(int *)((long)&pOVar1[2]._vptr_ON_Value + 4)) {
      *(undefined4 *)&pOVar1[2]._vptr_ON_Value = 0;
    }
    ON_SimpleArray<ON_UUID_struct>::SetCapacity
              ((ON_SimpleArray<ON_UUID_struct> *)(pOVar1 + 1),(long)count);
    ON_SimpleArray<ON_UUID_struct>::Append((ON_SimpleArray<ON_UUID_struct> *)(pOVar1 + 1),count,u);
  }
  return pOVar1 != (ON_Value *)0x0;
}

Assistant:

bool ON_HistoryRecord::SetUuidValues( int value_id, int count, const ON_UUID* u )
{
  ON_UuidValue* v = static_cast<ON_UuidValue*>(FindValueHelper(value_id,ON_Value::uuid_value,true));
  if ( v )
  {
    v->m_value.SetCount(0);
    v->m_value.SetCapacity(count);
    v->m_value.Append(count,u);
  }
  return (0 != v);
}